

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall
MipsParser::parseVfpuControlRegister(MipsParser *this,Parser *parser,MipsRegisterValue *reg)

{
  char *__s;
  Identifier *this_00;
  bool bVar1;
  int64_t iVar2;
  allocator<char> local_91;
  string local_90;
  Identifier local_70;
  string_view local_50;
  int local_3c;
  Identifier *pIStack_38;
  int i;
  Identifier *identifier;
  Token *token;
  MipsRegisterValue *reg_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  token = (Token *)reg;
  reg_local = (MipsRegisterValue *)parser;
  parser_local = (Parser *)this;
  identifier = (Identifier *)Parser::peekToken(parser,0);
  if (((Token *)identifier)->type == Identifier) {
    pIStack_38 = Token::identifierValue((Token *)identifier);
    for (local_3c = 0; this_00 = pIStack_38, local_3c < 0x10; local_3c = local_3c + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_50,parseVfpuControlRegister::vfpuCtrlNames[local_3c]);
      bVar1 = Identifier::operator==(this_00,local_50);
      if (bVar1) {
        *(int *)((long)&(token->value).
                        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                + 0x10) = local_3c;
        Identifier::operator=((Identifier *)&token->column,pIStack_38);
        Parser::eatToken((Parser *)reg_local);
        return true;
      }
    }
  }
  else if ((((Token *)identifier)->type == Integer) &&
          (iVar2 = Token::intValue((Token *)identifier), iVar2 < 0x10)) {
    iVar2 = Token::intValue((Token *)identifier);
    *(int *)((long)&(token->value).
                    super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                    super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .
                    super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .
                    super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
            + 0x10) = (int)iVar2;
    __s = parseVfpuControlRegister::vfpuCtrlNames
          [*(int *)((long)&(token->value).
                           super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   + 0x10)];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_91);
    Identifier::Identifier(&local_70,&local_90);
    Identifier::operator=((Identifier *)&token->column,&local_70);
    Identifier::~Identifier(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    Parser::eatToken((Parser *)reg_local);
    return true;
  }
  return false;
}

Assistant:

bool MipsParser::parseVfpuControlRegister(Parser& parser, MipsRegisterValue& reg)
{
	static const char* vfpuCtrlNames[16] = {
		"spfx", "tpfx", "dpfx", "cc",
		"inf4", "rsv5", "rsv6", "rev",
		"rcx0", "rcx1", "rcx2", "rcx3",
		"rcx4", "rcx5", "rcx6", "rcx7",
	};

	const Token& token = parser.peekToken();

	if (token.type == TokenType::Identifier)
	{
		const auto &identifier = token.identifierValue();
		for (int i = 0; i < 16; i++)
		{
			if (identifier == vfpuCtrlNames[i])
			{
				reg.num = i;
				reg.name = identifier;

				parser.eatToken();
				return true;
			}
		}
	} else if (token.type == TokenType::Integer && token.intValue() <= 15)
	{
		reg.num = (int) token.intValue();
		reg.name = Identifier(vfpuCtrlNames[reg.num]);

		parser.eatToken();
		return true;
	}

	return false;
}